

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void writeWithCommas(raw_ostream *S,ArrayRef<char> Buffer)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  void *__buf;
  size_t sVar6;
  ArrayRef<char> AVar7;
  raw_ostream *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  raw_ostream *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined1 auStack_30 [4];
  int InitialDigits;
  ArrayRef<char> ThisGroup;
  raw_ostream *S_local;
  ArrayRef<char> Buffer_local;
  
  Buffer_local.Data = (char *)Buffer.Length;
  S_local = (raw_ostream *)Buffer.Data;
  ThisGroup.Length = (size_type)S;
  bVar2 = llvm::ArrayRef<char>::empty((ArrayRef<char> *)&S_local);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!Buffer.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/NativeFormatting.cpp"
                  ,0x21,"void writeWithCommas(raw_ostream &, ArrayRef<char>)");
  }
  llvm::ArrayRef<char>::ArrayRef((ArrayRef<char> *)auStack_30);
  sVar4 = llvm::ArrayRef<char>::size((ArrayRef<char> *)&S_local);
  sVar6 = 3;
  iVar3 = (int)((sVar4 - 1) % 3) + 1;
  AVar7 = llvm::ArrayRef<char>::take_front((ArrayRef<char> *)&S_local,(long)iVar3);
  sVar1 = ThisGroup.Length;
  local_48 = AVar7.Data;
  _auStack_30 = local_48;
  local_40 = (char *)AVar7.Length;
  ThisGroup.Data = local_40;
  pcVar5 = llvm::ArrayRef<char>::data((ArrayRef<char> *)auStack_30);
  __buf = (void *)llvm::ArrayRef<char>::size((ArrayRef<char> *)auStack_30);
  llvm::raw_ostream::write((raw_ostream *)sVar1,(int)pcVar5,__buf,sVar6);
  AVar7 = llvm::ArrayRef<char>::drop_front((ArrayRef<char> *)&S_local,(long)iVar3);
  local_58 = (raw_ostream *)AVar7.Data;
  S_local = local_58;
  local_50 = (char *)AVar7.Length;
  Buffer_local.Data = local_50;
  sVar4 = llvm::ArrayRef<char>::size((ArrayRef<char> *)&S_local);
  sVar6 = 3;
  if (sVar4 % 3 != 0) {
    __assert_fail("Buffer.size() % 3 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/NativeFormatting.cpp"
                  ,0x29,"void writeWithCommas(raw_ostream &, ArrayRef<char>)");
  }
  while (bVar2 = llvm::ArrayRef<char>::empty((ArrayRef<char> *)&S_local), ((bVar2 ^ 0xffU) & 1) != 0
        ) {
    llvm::raw_ostream::operator<<((raw_ostream *)ThisGroup.Length,',');
    AVar7 = llvm::ArrayRef<char>::take_front((ArrayRef<char> *)&S_local,3);
    sVar1 = ThisGroup.Length;
    local_68 = AVar7.Data;
    _auStack_30 = local_68;
    local_60 = (char *)AVar7.Length;
    ThisGroup.Data = local_60;
    pcVar5 = llvm::ArrayRef<char>::data((ArrayRef<char> *)auStack_30);
    llvm::raw_ostream::write((raw_ostream *)sVar1,(int)pcVar5,(void *)0x3,sVar6);
    AVar7 = llvm::ArrayRef<char>::drop_front((ArrayRef<char> *)&S_local,3);
    local_78 = (raw_ostream *)AVar7.Data;
    S_local = local_78;
    local_70 = (char *)AVar7.Length;
    Buffer_local.Data = local_70;
  }
  return;
}

Assistant:

static void writeWithCommas(raw_ostream &S, ArrayRef<char> Buffer) {
  assert(!Buffer.empty());

  ArrayRef<char> ThisGroup;
  int InitialDigits = ((Buffer.size() - 1) % 3) + 1;
  ThisGroup = Buffer.take_front(InitialDigits);
  S.write(ThisGroup.data(), ThisGroup.size());

  Buffer = Buffer.drop_front(InitialDigits);
  assert(Buffer.size() % 3 == 0);
  while (!Buffer.empty()) {
    S << ',';
    ThisGroup = Buffer.take_front(3);
    S.write(ThisGroup.data(), 3);
    Buffer = Buffer.drop_front(3);
  }
}